

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O1

int TIFFWriteDirectoryTagLongLong8Array
              (TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir,uint16_t tag,uint32_t count,
              uint64_t *value)

{
  int iVar1;
  uint32_t uVar2;
  undefined8 in_RAX;
  uint64_t uVar3;
  uint32_t *value_00;
  long lVar4;
  char *fmt;
  bool bVar5;
  
  uVar2 = (uint32_t)in_RAX;
  if (dir == (TIFFDirEntry *)0x0) {
    *ndir = *ndir + 1;
    return 1;
  }
  if ((tif->tif_dir).td_deferstrilearraywriting != '\0') {
    iVar1 = TIFFWriteDirectoryTagData(tif,ndir,dir,tag,0,0,0,(void *)0x0);
    return iVar1;
  }
  if ((tif->tif_flags & 0x80000) != 0) {
    if (tag == 0x117 && 1 < count) {
      uVar3 = TIFFStripSize64(tif);
LAB_002bdf17:
      uVar2 = _WriteAsType(tif,uVar3,0xffffffff);
      bVar5 = uVar2 == 0;
    }
    else {
      uVar2 = (uint32_t)CONCAT71((int7)((ulong)in_RAX >> 8),count < 2);
      if (tag == 0x145 && count >= 2) {
        uVar3 = TIFFTileSize64(tif);
        goto LAB_002bdf17;
      }
      bVar5 = false;
    }
    if (!bVar5) {
      iVar1 = TIFFWriteDirectoryTagCheckedLong8Array(tif,ndir,dir,tag,count,value);
      return iVar1;
    }
  }
  if (tag == 0x117 && 1 < count) {
    uVar3 = TIFFStripSize64(tif);
LAB_002bdfa1:
    iVar1 = _WriteAsType(tif,uVar3,0xffff);
    bVar5 = iVar1 == 0;
  }
  else {
    if (tag == 0x145 && 1 < count) {
      uVar3 = TIFFTileSize64(tif);
      goto LAB_002bdfa1;
    }
    bVar5 = false;
  }
  if (bVar5) {
    value_00 = (uint32_t *)_TIFFmallocExt(tif,(ulong)count * 2);
    if (value_00 != (uint32_t *)0x0) {
      if (count != 0) {
        lVar4 = 0;
LAB_002bdfe5:
        if (value[lVar4] < 0x10000) goto code_r0x002bdff6;
        fmt = "Attempt to write value larger than 0xFFFF in SHORT array.";
LAB_002be0c4:
        TIFFErrorExtR(tif,"TIFFWriteDirectoryTagLongLong8Array",fmt);
        _TIFFfreeExt(tif,value_00);
        goto LAB_002be0dc;
      }
LAB_002be003:
      count = TIFFWriteDirectoryTagCheckedShortArray(tif,ndir,dir,tag,count,(uint16_t *)value_00);
LAB_002be073:
      _TIFFfreeExt(tif,value_00);
      bVar5 = true;
      goto LAB_002be0de;
    }
  }
  else {
    value_00 = (uint32_t *)_TIFFmallocExt(tif,(ulong)count * 4);
    if (value_00 != (uint32_t *)0x0) {
      if (count != 0) {
        lVar4 = 0;
        do {
          if (value[lVar4] >> 0x20 != 0) {
            fmt = "Attempt to write value larger than 0xFFFFFFFF in LONG array.";
            goto LAB_002be0c4;
          }
          value_00[lVar4] = (uint32_t)value[lVar4];
          lVar4 = lVar4 + 1;
        } while (count != (uint32_t)lVar4);
      }
      count = TIFFWriteDirectoryTagCheckedLongArray(tif,ndir,dir,tag,count,value_00);
      goto LAB_002be073;
    }
  }
  TIFFErrorExtR(tif,"TIFFWriteDirectoryTagLongLong8Array","Out of memory");
LAB_002be0dc:
  bVar5 = false;
  uVar2 = 0;
LAB_002be0de:
  if (bVar5) {
    uVar2 = count;
  }
  return uVar2;
code_r0x002bdff6:
  *(uint16_t *)((long)value_00 + lVar4 * 2) = (uint16_t)value[lVar4];
  lVar4 = lVar4 + 1;
  if (count == (uint32_t)lVar4) goto LAB_002be003;
  goto LAB_002bdfe5;
}

Assistant:

static int TIFFWriteDirectoryTagLongLong8Array(TIFF *tif, uint32_t *ndir,
                                               TIFFDirEntry *dir, uint16_t tag,
                                               uint32_t count, uint64_t *value)
{
    static const char module[] = "TIFFWriteDirectoryTagLongLong8Array";
    int o;
    int write_aslong4;

    /* is this just a counting pass? */
    if (dir == NULL)
    {
        (*ndir)++;
        return (1);
    }

    if (tif->tif_dir.td_deferstrilearraywriting)
    {
        return TIFFWriteDirectoryTagData(tif, ndir, dir, tag, TIFF_NOTYPE, 0, 0,
                                         NULL);
    }

    if (tif->tif_flags & TIFF_BIGTIFF)
    {
        int write_aslong8 = 1;
        /* In the case of ByteCounts array, we may be able to write them on */
        /* LONG if the strip/tilesize is not too big. */
        /* Also do that for count > 1 in the case someone would want to create
         */
        /* a single-strip file with a growing height, in which case using */
        /* LONG8 will be safer. */
        if (count > 1 && tag == TIFFTAG_STRIPBYTECOUNTS)
        {
            write_aslong8 = WriteAsLong8(tif, TIFFStripSize64(tif));
        }
        else if (count > 1 && tag == TIFFTAG_TILEBYTECOUNTS)
        {
            write_aslong8 = WriteAsLong8(tif, TIFFTileSize64(tif));
        }
        if (write_aslong8)
        {
            return TIFFWriteDirectoryTagCheckedLong8Array(tif, ndir, dir, tag,
                                                          count, value);
        }
    }

    write_aslong4 = 1;
    if (count > 1 && tag == TIFFTAG_STRIPBYTECOUNTS)
    {
        write_aslong4 = WriteAsLong4(tif, TIFFStripSize64(tif));
    }
    else if (count > 1 && tag == TIFFTAG_TILEBYTECOUNTS)
    {
        write_aslong4 = WriteAsLong4(tif, TIFFTileSize64(tif));
    }
    if (write_aslong4)
    {
        /*
        ** For classic tiff we want to verify everything is in range for LONG
        ** and convert to long format.
        */

        uint32_t *p = _TIFFmallocExt(tif, count * sizeof(uint32_t));
        uint32_t *q;
        uint64_t *ma;
        uint32_t mb;

        if (p == NULL)
        {
            TIFFErrorExtR(tif, module, "Out of memory");
            return (0);
        }

        for (q = p, ma = value, mb = 0; mb < count; ma++, mb++, q++)
        {
            if (*ma > 0xFFFFFFFF)
            {
                TIFFErrorExtR(tif, module,
                              "Attempt to write value larger than 0xFFFFFFFF "
                              "in LONG array.");
                _TIFFfreeExt(tif, p);
                return (0);
            }
            *q = (uint32_t)(*ma);
        }

        o = TIFFWriteDirectoryTagCheckedLongArray(tif, ndir, dir, tag, count,
                                                  p);
        _TIFFfreeExt(tif, p);
    }
    else
    {
        uint16_t *p = _TIFFmallocExt(tif, count * sizeof(uint16_t));
        uint16_t *q;
        uint64_t *ma;
        uint32_t mb;

        if (p == NULL)
        {
            TIFFErrorExtR(tif, module, "Out of memory");
            return (0);
        }

        for (q = p, ma = value, mb = 0; mb < count; ma++, mb++, q++)
        {
            if (*ma > 0xFFFF)
            {
                /* Should not happen normally given the check we did before */
                TIFFErrorExtR(tif, module,
                              "Attempt to write value larger than 0xFFFF in "
                              "SHORT array.");
                _TIFFfreeExt(tif, p);
                return (0);
            }
            *q = (uint16_t)(*ma);
        }

        o = TIFFWriteDirectoryTagCheckedShortArray(tif, ndir, dir, tag, count,
                                                   p);
        _TIFFfreeExt(tif, p);
    }

    return (o);
}